

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

unsigned_long
assembler::(anonymous_namespace)::_call_external_3_1<unsigned_long,bool>
          (external_function *f,
          vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *args,
          registers *regs)

{
  code *pcVar1;
  size_type sVar2;
  const_reference pvVar3;
  registers *regs_local;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *args_local;
  external_function *f_local;
  
  sVar2 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          size(args);
  if (sVar2 == 3) {
    pvVar3 = std::
             vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
             ::operator[](&f->arguments,1);
    switch(*pvVar3) {
    case T_BOOL:
      f_local = (external_function *)_call_external_3_2<unsigned_long,bool,bool>(f,args,regs);
      break;
    case T_CHAR_POINTER:
      f_local = (external_function *)_call_external_3_2<unsigned_long,bool,char*>(f,args,regs);
      break;
    case T_DOUBLE:
      f_local = (external_function *)_call_external_3_2<unsigned_long,bool,double>(f,args,regs);
      break;
    case T_INT64:
      f_local = (external_function *)_call_external_3_2<unsigned_long,bool,long>(f,args,regs);
      break;
    case T_VOID:
      f_local = (external_function *)0x0;
      break;
    default:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    return (unsigned_long)f_local;
  }
  __assert_fail("args.size() == 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/asm/vm.cpp"
                ,0x711,
                "T assembler::(anonymous namespace)::_call_external_3_1(const external_function &, std::vector<asmcode::operand> &, registers &) [T = unsigned long, T1 = bool]"
               );
}

Assistant:

T _call_external_3_1(const external_function& f, std::vector<asmcode::operand>& args, registers& regs)
  {
      assert(args.size() == 3);
      switch (f.arguments[1])
      {
          case external_function::T_BOOL: return _call_external_3_2<T,T1, bool>(f, args, regs);
          case external_function::T_CHAR_POINTER: return _call_external_3_2<T,T1, char*>(f, args, regs);
          case external_function::T_DOUBLE: return _call_external_3_2<T, T1,double>(f, args, regs);
          case external_function::T_INT64: return _call_external_3_2<T, T1,int64_t>(f, args, regs);
          case external_function::T_VOID: return 0;
      }
  }